

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryDefaultState::iterate
          (TransformFeedbackOverflowQueryDefaultState *this)

{
  bool bVar1;
  TestError *this_00;
  uint uVar2;
  
  bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                    (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ec,0,0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is non-zero"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0xfb);
LAB_008613ed:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if ((bVar1) &&
     ((this->super_TransformFeedbackOverflowQueryContextStateBase).
      super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams != 0)) {
    uVar2 = 0;
    do {
      bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                        (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,0,0);
      if (!bVar1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,
                   "Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is non-zero"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                   ,0x105);
        goto LAB_008613ed;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_TransformFeedbackOverflowQueryContextStateBase).
                     super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams);
  }
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryContextStateBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, 0))
		{
			TCU_FAIL("Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is non-zero");
		}

		if (supportsTransformFeedback3())
		{
			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, 0, 0))
				{
					TCU_FAIL("Default value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
							 "is non-zero");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}